

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O2

void __thiscall CharScanner::matchRange(CharScanner *this,int c1,int c2)

{
  int iVar1;
  ScannerException *this_00;
  char *__rhs;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0x12])(this,1);
  if (c1 <= iVar1) {
    iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0x12])(this,1);
    if (iVar1 <= c2) {
      (*(this->super_TokenStream)._vptr_TokenStream[6])(this);
      return;
    }
  }
  this_00 = (ScannerException *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_78,"char out of range: \'",&local_79);
  iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0x12])(this,1);
  if (iVar1 == -1) {
    __rhs = "EOF";
  }
  else {
    charName::buf[0] = (char)iVar1;
    __rhs = charName::buf;
    charName::buf[1] = '\0';
  }
  std::operator+(&local_58,&local_78,__rhs);
  std::operator+(&local_38,&local_58,"\'");
  ScannerException::ScannerException(this_00,&local_38,((this->inputState).ref)->ptr->line);
  __cxa_throw(this_00,&ScannerException::typeinfo,ANTLRException::~ANTLRException);
}

Assistant:

void CharScanner::matchRange(int c1, int c2)
{
	if (LA(1)<c1 || LA(1)>c2) {
		throw ScannerException(std::string("char out of range: '") + charName(LA(1)) + "'", inputState->line);
	}
	consume();
}